

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O2

yyjson_doc *
duckdb_yyjson::read_root_single
          (u8 *hdr,u8 *cur,u8 *end,yyjson_alc alc,yyjson_read_flag flg,yyjson_read_err *err)

{
  code *pcVar1;
  ulong *puVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  yyjson_read_code yVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  sbyte sVar21;
  ushort uVar22;
  undefined8 uVar23;
  u8 *puVar24;
  yyjson_read_err *pyVar25;
  bool bVar26;
  yyjson_doc *pyVar27;
  long lVar28;
  u8 *puVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  code cVar33;
  long lVar34;
  char *pcVar35;
  int iVar36;
  uint uVar37;
  _func_void_ptr_void_ptr_size_t *p_Var38;
  uint uVar39;
  u8 **pre;
  ulong uVar40;
  code cVar41;
  byte bVar42;
  int iVar43;
  uint uVar44;
  _func_void_ptr_void_ptr_size_t *p_Var45;
  ulong uVar46;
  yyjson_doc *val;
  yyjson_val *pyVar47;
  long lVar48;
  _func_void_ptr_void_ptr_size_t *p_Var49;
  u8 *cur_1;
  _func_void_ptr_void_ptr_size_t *p_Var50;
  long lVar51;
  ulong uVar52;
  _func_void_ptr_void_ptr_size_t *p_Var53;
  _func_void_ptr_void_ptr_size_t *p_Var54;
  _func_void_ptr_void_ptr_size_t *p_Var55;
  char cVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  _func_void_ptr_void_ptr_size_t *local_4b0;
  u8 **local_4a8;
  _func_void_ptr_void_ptr_size_t *local_4a0;
  _func_void_ptr_void_ptr_size_t *local_498;
  u8 *local_490;
  ulong local_488;
  yyjson_doc *local_480;
  _func_void_ptr_void_ptr_size_t *local_478;
  yyjson_doc *local_470;
  _func_void_ptr_void_ptr_size_t *local_468;
  char *local_460;
  yyjson_read_err *local_458;
  i32 exp;
  u8 *raw_end;
  bigint big_full;
  uint local_238 [2];
  long local_230 [64];
  
  local_4b0 = (_func_void_ptr_void_ptr_size_t *)cur;
  local_4a0 = (_func_void_ptr_void_ptr_size_t *)end;
  local_490 = hdr;
  pyVar27 = (yyjson_doc *)(*alc.malloc)(alc.ctx,0x50);
  puVar24 = local_490;
  p_Var49 = local_4a0;
  if (pyVar27 == (yyjson_doc *)0x0) {
    bVar26 = is_truncated_end(local_490,cur,(u8 *)local_4a0,2,flg);
    if (bVar26) {
      err->pos = (long)p_Var49 - (long)puVar24;
      err->code = 5;
      pcVar35 = "unexpected end of data";
    }
    else {
      err->pos = (long)cur - (long)puVar24;
      err->code = 2;
      pcVar35 = "memory allocation failed";
    }
    err->msg = pcVar35;
LAB_01b97e36:
    pyVar27 = (yyjson_doc *)0x0;
  }
  else {
    val = pyVar27 + 1;
    cVar56 = (char)flg;
    pre = (u8 **)0x0;
    if ((flg & 0xa0) != 0) {
      pre = &raw_end;
    }
    raw_end = (u8 *)0x0;
    bVar42 = *cur;
    uVar31 = (ulong)bVar42;
    local_458 = err;
    if ((char_table[uVar31] & 2) == 0) {
      if (bVar42 == 0x74) {
        if (*(int *)cur == 0x65757274) {
          val->root = (yyjson_val *)0xb;
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 4);
          goto LAB_01b977ae;
        }
LAB_01b98466:
        bVar26 = is_truncated_end(local_490,cur,(u8 *)local_4a0,0xb,flg);
        if (bVar26) {
          cur = (u8 *)p_Var49;
        }
        yVar16 = 5;
        if (!bVar26) {
          yVar16 = 0xb;
        }
        pcVar35 = "invalid literal";
        if (bVar26) {
          pcVar35 = "unexpected end of data";
        }
        err->pos = (long)cur - (long)puVar24;
        err->code = yVar16;
        err->msg = pcVar35;
LAB_01b9773f:
        (*alc.free)(alc.ctx,pyVar27);
        goto LAB_01b97e36;
      }
      if (bVar42 == 0x66) {
        if (*(int *)(cur + 1) != 0x65736c61) goto LAB_01b98466;
        val->root = (yyjson_val *)0x3;
        local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 5);
      }
      else {
        if (bVar42 != 0x6e) {
          if (bVar42 == 0x22) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)(cur + 1);
            p_Var54 = p_Var50;
LAB_01b970c7:
            while (uVar31 = (ulong)(byte)*p_Var54, (char_table[uVar31] & 0xc) == 0) {
              uVar31 = (ulong)(byte)p_Var54[1];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 1;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[2];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 2;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[3];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 3;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[4];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 4;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[5];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 5;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[6];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 6;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[7];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 7;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[8];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 8;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[9];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 9;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[10];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 10;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[0xb];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 0xb;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[0xc];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 0xc;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[0xd];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 0xd;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[0xe];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 0xe;
                break;
              }
              uVar31 = (ulong)(byte)p_Var54[0xf];
              if ((char_table[uVar31] & 0xc) != 0) {
                p_Var54 = p_Var54 + 0xf;
                break;
              }
              p_Var54 = p_Var54 + 0x10;
            }
            if ((char)uVar31 == '\"') {
              pyVar27[1].root = (yyjson_val *)(((long)p_Var54 - (long)p_Var50) * 0x100 | 0xd);
              pyVar27[1].alc.malloc = p_Var50;
              *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x0;
              local_4b0 = p_Var54 + 1;
              goto LAB_01b977ae;
            }
            local_468 = (_func_void_ptr_void_ptr_size_t *)0x20f6e9f;
            if (-1 < (char)uVar31) {
              p_Var45 = p_Var54;
LAB_01b98bad:
              p_Var38 = p_Var45;
              if ((byte)uVar31 != 0x5c) {
                if ((int)uVar31 != 0x22) {
                  if ((flg & 0x40) == 0) {
                    p_Var53 = (_func_void_ptr_void_ptr_size_t *)
                              "unexpected control character in string";
                  }
                  else {
                    if (p_Var45 < local_4a0) {
                      p_Var55 = p_Var45 + 1;
                      *p_Var54 = (_func_void_ptr_void_ptr_size_t)(byte)uVar31;
                      p_Var53 = p_Var54 + 1;
                      goto LAB_01b98ce4;
                    }
                    local_468 = (_func_void_ptr_void_ptr_size_t *)0x20f6f8a;
                    p_Var53 = local_468;
                  }
                  goto LAB_01b991ae;
                }
                pyVar27[1].root = (yyjson_val *)(((long)p_Var54 - (long)p_Var50) * 0x100 | 5);
                pyVar27[1].alc.malloc = p_Var50;
                *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x0;
                local_4b0 = p_Var45 + 1;
                local_4a8 = pre;
                local_480 = val;
                local_470 = pyVar27;
                goto LAB_01b977ae;
              }
              cVar33 = p_Var45[1];
              switch(cVar33) {
              case (code)0x6e:
                *p_Var54 = (_func_void_ptr_void_ptr_size_t)0xa;
                break;
              case (code)0x6f:
              case (code)0x70:
              case (code)0x71:
              case (code)0x73:
switchD_01b98c03_caseD_6f:
                p_Var38 = p_Var45 + 1;
                p_Var53 = (_func_void_ptr_void_ptr_size_t *)"invalid escaped character in string";
                goto LAB_01b991ae;
              case (code)0x72:
                *p_Var54 = (_func_void_ptr_void_ptr_size_t)0xd;
                break;
              case (code)0x74:
                *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x9;
                break;
              case (code)0x75:
                uVar22 = CONCAT11(hex_conv_table[(byte)p_Var45[3]],hex_conv_table[(byte)p_Var45[5]])
                ;
                p_Var53 = (_func_void_ptr_void_ptr_size_t *)"invalid escaped sequence in string";
                if (((uVar22 | CONCAT11(hex_conv_table[(byte)p_Var45[2]],
                                        hex_conv_table[(byte)p_Var45[4]])) & 0xf0f0) == 0) {
                  uVar39 = (uint)CONCAT11(hex_conv_table[(byte)p_Var45[2]],
                                          hex_conv_table[(byte)p_Var45[4]]) << 4;
                  uVar37 = uVar22 | uVar39;
                  p_Var55 = p_Var45 + 6;
                  if ((uVar37 & 0xf800) != 0xd800) {
                    bVar42 = (byte)uVar37;
                    if ((ushort)uVar37 < 0x800) {
                      if ((ushort)uVar37 < 0x80) {
                        *p_Var54 = (_func_void_ptr_void_ptr_size_t)bVar42;
                        p_Var53 = p_Var54 + 1;
                      }
                      else {
                        *p_Var54 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar37 >> 6) | 0xc0);
                        p_Var54[1] = (_func_void_ptr_void_ptr_size_t)(bVar42 & 0x3f | 0x80);
                        p_Var53 = p_Var54 + 2;
                      }
                    }
                    else {
                      *p_Var54 = (_func_void_ptr_void_ptr_size_t)
                                 ((byte)(((uint)uVar22 | uVar39 & 0xffff) >> 0xc) | 0xe0);
                      p_Var54[1] = (_func_void_ptr_void_ptr_size_t)
                                   ((byte)(uVar37 >> 6) & 0x3f | 0x80);
                      p_Var54[2] = (_func_void_ptr_void_ptr_size_t)(bVar42 & 0x3f | 0x80);
                      p_Var53 = p_Var54 + 3;
                    }
                    goto LAB_01b98ce4;
                  }
                  if ((uVar37 & 0xdc00) == 0xd800) {
                    p_Var38 = p_Var55;
                    if (*(ushort *)p_Var55 == 0x755c) {
                      if (((CONCAT11(hex_conv_table[(byte)p_Var45[9]],
                                     hex_conv_table[(byte)p_Var45[0xb]]) |
                           CONCAT11(hex_conv_table[(byte)p_Var45[8]],
                                    hex_conv_table[(byte)p_Var45[10]])) & 0xf0f0) == 0) {
                        uVar39 = (CONCAT11(hex_conv_table[(byte)p_Var45[8]],
                                           hex_conv_table[(byte)p_Var45[10]]) & 0xfff) << 4 |
                                 (uint)CONCAT11(hex_conv_table[(byte)p_Var45[9]],
                                                hex_conv_table[(byte)p_Var45[0xb]]);
                        if ((uVar39 & 0xfc00) == 0xdc00) {
                          iVar36 = (uVar37 & 0xdbff) * 0x400;
                          uVar37 = iVar36 + uVar39 + 0xfca02400;
                          *p_Var54 = (_func_void_ptr_void_ptr_size_t)((byte)(uVar37 >> 0x12) | 0xf0)
                          ;
                          p_Var54[1] = (_func_void_ptr_void_ptr_size_t)
                                       ((byte)(uVar37 >> 0xc) & 0x3f | 0x80);
                          p_Var54[2] = (_func_void_ptr_void_ptr_size_t)
                                       ((byte)(uVar39 + iVar36 + 0x400 >> 6) & 0x3f | 0x80);
                          p_Var54[3] = (_func_void_ptr_void_ptr_size_t)((byte)uVar39 & 0x3f | 0x80);
                          p_Var55 = p_Var45 + 0xc;
                          p_Var53 = p_Var54 + 4;
                          goto LAB_01b98ce4;
                        }
                        p_Var53 = (_func_void_ptr_void_ptr_size_t *)
                                  "invalid low surrogate in string";
                      }
                    }
                    else {
                      p_Var53 = (_func_void_ptr_void_ptr_size_t *)"no low surrogate in string";
                    }
                  }
                  else {
                    p_Var53 = (_func_void_ptr_void_ptr_size_t *)"invalid high surrogate in string";
                  }
                }
LAB_01b991ae:
                local_468 = p_Var53;
                local_4a8 = pre;
                local_480 = val;
                local_470 = pyVar27;
                bVar26 = is_truncated_end(local_490,(u8 *)p_Var38,(u8 *)local_4a0,10,flg);
                if (bVar26) {
                  p_Var38 = p_Var49;
                }
                p_Var49 = (_func_void_ptr_void_ptr_size_t *)"unexpected end of data";
                if (!bVar26) {
                  p_Var49 = local_468;
                }
                local_458->pos = (long)p_Var38 - (long)puVar24;
                local_458->code = (uint)!bVar26 * 5 + 5;
                local_458->msg = (char *)p_Var49;
                pyVar27 = local_470;
                goto LAB_01b9773f;
              default:
                if (cVar33 == (code)0x66) {
                  *p_Var54 = (_func_void_ptr_void_ptr_size_t)0xc;
                }
                else if (cVar33 == (code)0x2f) {
                  *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x2f;
                }
                else if (cVar33 == (code)0x5c) {
                  *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x5c;
                }
                else if (cVar33 == (code)0x62) {
                  *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x8;
                }
                else {
                  if (cVar33 != (code)0x22) goto switchD_01b98c03_caseD_6f;
                  *p_Var54 = (_func_void_ptr_void_ptr_size_t)0x22;
                }
              }
              p_Var55 = p_Var45 + 2;
              p_Var53 = p_Var54 + 1;
LAB_01b98ce4:
              do {
                p_Var54 = p_Var53;
                p_Var38 = p_Var55;
                if ((char_table[(byte)*p_Var55] & 0xc) == 0) {
                  if ((char_table[(byte)p_Var55[1]] & 0xc) != 0) {
                    uVar37 = (uint)*(ushort *)p_Var55;
                    goto LAB_01b98df3;
                  }
                  if ((char_table[(byte)p_Var55[2]] & 0xc) == 0) {
                    if ((char_table[(byte)p_Var55[3]] & 0xc) == 0) {
                      if ((char_table[(byte)p_Var55[4]] & 0xc) == 0) {
                        if ((char_table[(byte)p_Var55[5]] & 0xc) == 0) {
                          if ((char_table[(byte)p_Var55[6]] & 0xc) == 0) {
                            if ((char_table[(byte)p_Var55[7]] & 0xc) == 0) {
                              if ((char_table[(byte)p_Var55[8]] & 0xc) == 0) {
                                if ((char_table[(byte)p_Var55[9]] & 0xc) == 0) {
                                  if ((char_table[(byte)p_Var55[10]] & 0xc) == 0) {
                                    if ((char_table[(byte)p_Var55[0xb]] & 0xc) == 0) {
                                      if ((char_table[(byte)p_Var55[0xc]] & 0xc) == 0) {
                                        if ((char_table[(byte)p_Var55[0xd]] & 0xc) == 0) {
                                          if ((char_table[(byte)p_Var55[0xe]] & 0xc) == 0) {
                                            bVar42 = char_table[(byte)p_Var55[0xf]];
                                            uVar23 = *(undefined8 *)(p_Var55 + 8);
                                            *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                            *(undefined8 *)(p_Var54 + 8) = uVar23;
                                            if ((bVar42 & 0xc) == 0) {
                                              p_Var55 = p_Var55 + 0x10;
                                              p_Var53 = p_Var54 + 0x10;
                                              goto LAB_01b98ce4;
                                            }
                                            p_Var38 = p_Var55 + 0xf;
                                            p_Var54 = p_Var54 + 0xf;
                                          }
                                          else {
                                            *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                            *(uint *)(p_Var54 + 8) = *(uint *)(p_Var55 + 8);
                                            *(ushort *)(p_Var54 + 0xc) = *(ushort *)(p_Var55 + 0xc);
                                            p_Var54 = p_Var54 + 0xe;
                                            p_Var38 = p_Var55 + 0xe;
                                          }
                                        }
                                        else {
                                          *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                          *(uint *)(p_Var54 + 8) = *(uint *)(p_Var55 + 8);
                                          *(ushort *)(p_Var54 + 0xc) = *(ushort *)(p_Var55 + 0xc);
                                          p_Var54 = p_Var54 + 0xd;
                                          p_Var38 = p_Var55 + 0xd;
                                        }
                                      }
                                      else {
                                        *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                        *(uint *)(p_Var54 + 8) = *(uint *)(p_Var55 + 8);
                                        p_Var54 = p_Var54 + 0xc;
                                        p_Var38 = p_Var55 + 0xc;
                                      }
                                    }
                                    else {
                                      *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                      *(uint *)(p_Var54 + 8) = *(uint *)(p_Var55 + 8);
                                      p_Var54 = p_Var54 + 0xb;
                                      p_Var38 = p_Var55 + 0xb;
                                    }
                                  }
                                  else {
                                    *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                    *(ushort *)(p_Var54 + 8) = *(ushort *)(p_Var55 + 8);
                                    p_Var54 = p_Var54 + 10;
                                    p_Var38 = p_Var55 + 10;
                                  }
                                }
                                else {
                                  *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                  *(ushort *)(p_Var54 + 8) = *(ushort *)(p_Var55 + 8);
                                  p_Var54 = p_Var54 + 9;
                                  p_Var38 = p_Var55 + 9;
                                }
                              }
                              else {
                                p_Var38 = p_Var55 + 8;
                                *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                                p_Var54 = p_Var54 + 8;
                              }
                            }
                            else {
                              p_Var38 = p_Var55 + 7;
                              *(undefined8 *)p_Var54 = *(undefined8 *)p_Var55;
                              p_Var54 = p_Var54 + 7;
                            }
                          }
                          else {
                            *(uint *)p_Var54 = *(uint *)p_Var55;
                            *(ushort *)(p_Var54 + 4) = *(ushort *)(p_Var55 + 4);
                            p_Var54 = p_Var54 + 6;
                            p_Var38 = p_Var55 + 6;
                          }
                        }
                        else {
                          *(uint *)p_Var54 = *(uint *)p_Var55;
                          *(ushort *)(p_Var54 + 4) = *(ushort *)(p_Var55 + 4);
                          p_Var54 = p_Var54 + 5;
                          p_Var38 = p_Var55 + 5;
                        }
                      }
                      else {
                        p_Var38 = p_Var55 + 4;
                        *(uint *)p_Var54 = *(uint *)p_Var55;
                        p_Var54 = p_Var54 + 4;
                      }
                    }
                    else {
                      p_Var38 = p_Var55 + 3;
                      *(uint *)p_Var54 = *(uint *)p_Var55;
                      p_Var54 = p_Var54 + 3;
                    }
                  }
                  else {
                    p_Var38 = p_Var55 + 2;
                    *(ushort *)p_Var54 = *(ushort *)p_Var55;
                    p_Var54 = p_Var54 + 2;
                  }
                }
                while( true ) {
                  uVar31 = (ulong)(byte)*p_Var38;
                  p_Var45 = p_Var38;
                  if (-1 < (char)*p_Var38) goto LAB_01b98bad;
                  lVar28 = 0;
                  p_Var53 = p_Var54;
                  for (p_Var55 = p_Var38;
                      ((uVar37 = *(uint *)p_Var55, (uVar37 & 0xc0c0f0) == 0x8080e0 &&
                       ((uVar37 & 0x200f) != 0)) && ((uVar37 & 0x200f) != 0x200d));
                      p_Var55 = p_Var55 + 3) {
                    *(uint *)p_Var53 = uVar37;
                    p_Var53 = p_Var53 + 3;
                    lVar28 = lVar28 + 3;
                  }
                  if (-1 < (char)uVar37) break;
                  while (((uVar37 & 0xc0e0) == 0x80c0 && ((uVar37 & 0x1e) != 0))) {
                    *(ushort *)p_Var53 = (ushort)uVar37;
                    p_Var53 = p_Var53 + 2;
                    pcVar1 = p_Var55 + 2;
                    p_Var55 = p_Var55 + 2;
                    lVar28 = lVar28 + 2;
                    uVar37 = *(uint *)pcVar1;
                  }
                  while ((((uVar37 & 0x3007) != 0 && ((uVar37 & 0xc0c0c0f8) == 0x808080f0)) &&
                         (((byte)uVar37 >> 2 & (uVar37 & 0x3003) != 0) == 0))) {
                    *(uint *)(p_Var54 + lVar28) = uVar37;
                    lVar51 = lVar28 + 4;
                    lVar28 = lVar28 + 4;
                    uVar37 = *(uint *)(p_Var38 + lVar51);
                  }
                  p_Var55 = p_Var38 + lVar28;
                  p_Var54 = p_Var54 + lVar28;
                  p_Var53 = p_Var54;
                  if (lVar28 != 0) break;
                  p_Var53 = local_468;
                  if ((flg & 0x40) == 0) goto LAB_01b991ae;
LAB_01b98df3:
                  *(ushort *)p_Var54 = (ushort)uVar37;
                  p_Var54 = p_Var54 + 1;
                  p_Var38 = p_Var55 + 1;
                }
              } while( true );
            }
            lVar28 = 0;
            for (; ((uVar37 = *(uint *)p_Var54, (uVar37 & 0xc0c0f0) == 0x8080e0 &&
                    ((uVar37 & 0x200f) != 0)) && ((uVar37 & 0x200f) != 0x200d));
                p_Var54 = p_Var54 + 3) {
              lVar28 = lVar28 + -3;
            }
            local_4a8 = pre;
            local_480 = val;
            local_470 = pyVar27;
            if (-1 < (char)uVar37) goto LAB_01b970c7;
            while (((uVar37 & 0xc0e0) == 0x80c0 && ((uVar37 & 0x1e) != 0))) {
              pcVar1 = p_Var54 + 2;
              p_Var54 = p_Var54 + 2;
              lVar28 = lVar28 + -2;
              uVar37 = *(uint *)pcVar1;
            }
            while ((((uVar37 & 0xc0c0c0f8) == 0x808080f0 && ((uVar37 & 0x3007) != 0)) &&
                   (((byte)uVar37 >> 2 & (uVar37 & 0x3003) != 0) == 0))) {
              pcVar1 = p_Var54 + 4;
              p_Var54 = p_Var54 + 4;
              lVar28 = lVar28 + -4;
              uVar37 = *(uint *)pcVar1;
            }
            if (lVar28 != 0) goto LAB_01b970c7;
            p_Var38 = p_Var54;
            p_Var53 = local_468;
            if ((flg & 0x40) != 0) {
              p_Var54 = p_Var54 + 1;
              goto LAB_01b970c7;
            }
            goto LAB_01b991ae;
          }
          if ((flg & 0x10) != 0) {
            if (bVar42 == 0x69) {
LAB_01b984df:
              if (((cur[1] | 0x20) == 0x6e) && ((cur[2] | 0x20) == 0x66)) {
                local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
                if (((((cur[3] | 0x20) == 0x69) &&
                     (((cur[4] | 0x20) == 0x6e && ((cur[5] | 0x20) == 0x69)))) &&
                    ((cur[6] | 0x20) == 0x74)) && ((cur[7] | 0x20) == 0x79)) {
                  local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 8);
                }
                if ((flg & 0xa0) == 0) {
                  pyVar27[1].root = (yyjson_val *)0x14;
                  pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
                }
                else {
                  if (*pre != (u8 *)0x0) {
                    **pre = '\0';
                  }
                  *pre = (u8 *)local_4b0;
                  pyVar27[1].root = (yyjson_val *)(((long)local_4b0 - (long)cur) * 0x100 + 1);
                  pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
                }
                goto LAB_01b977ae;
              }
              if (bVar42 != 0x4e) goto LAB_01b976e5;
            }
            else if (bVar42 != 0x4e) {
              if (bVar42 != 0x49) goto LAB_01b976e5;
              goto LAB_01b984df;
            }
            if (((cur[1] | 0x20) == 0x61) && ((cur[2] | 0x20) == 0x6e)) {
              local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
              if ((flg & 0xa0) == 0) {
                pyVar27[1].root = (yyjson_val *)0x14;
                pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
              }
              else {
                if (*pre != (u8 *)0x0) {
                  **pre = '\0';
                }
                *pre = (u8 *)local_4b0;
                pyVar27[1].root = (yyjson_val *)0x301;
                pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
              }
              goto LAB_01b977ae;
            }
          }
LAB_01b976e5:
          bVar26 = is_truncated_end(local_490,cur,(u8 *)local_4a0,6,flg);
          if (bVar26) {
            cur = (u8 *)p_Var49;
          }
          pcVar35 = "unexpected character";
          if (bVar26) {
            pcVar35 = "unexpected end of data";
          }
          local_458->pos = (long)cur - (long)puVar24;
          local_458->code = 6 - bVar26;
          local_458->msg = pcVar35;
          goto LAB_01b9773f;
        }
        uVar37 = *(uint *)cur;
        if (uVar37 == 0x6c6c756e) {
          val->root = (yyjson_val *)0x2;
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 4);
        }
        else {
          if (((((flg & 0x10) == 0) || ((uVar37 & 0xff | 0x20) != 0x6e)) ||
              ((uVar37 >> 8 & 0xff | 0x20) != 0x61)) || ((uVar37 >> 0x10 & 0xff | 0x20) != 0x6e))
          goto LAB_01b98466;
          local_4b0 = (_func_void_ptr_void_ptr_size_t *)(cur + 3);
          if ((flg & 0xa0) == 0) {
            pyVar27[1].root = (yyjson_val *)0x14;
            pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x7ff8000000000000;
          }
          else {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            *pre = (u8 *)local_4b0;
            pyVar27[1].root = (yyjson_val *)0x301;
            pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
          }
        }
      }
      goto LAB_01b977ae;
    }
    exp = 0;
    if (-1 < cVar56 && (flg & 0xa0) != 0) {
      bVar26 = read_number_raw((u8 **)&local_4b0,pre,flg,(yyjson_val *)val,&local_460);
      p_Var49 = local_4b0;
      if (!bVar26) goto LAB_01b97ddb;
      goto LAB_01b977ae;
    }
    uVar52 = (ulong)(bVar42 == 0x2d);
    p_Var54 = (_func_void_ptr_void_ptr_size_t *)(cur + uVar52);
    bVar32 = cur[uVar52];
    uVar30 = (ulong)bVar32;
    if ((digi_table[uVar30] & 2) == 0) {
      if (bVar32 == 0x30) {
        p_Var49 = p_Var54 + 1;
        bVar32 = digi_table[(byte)p_Var54[1]];
        if ((bVar32 & 0x33) == 0) {
          pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
          pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
          local_4b0 = p_Var49;
          local_4a8 = pre;
          goto LAB_01b977ae;
        }
        local_498 = p_Var49;
        if (p_Var54[1] == (_func_void_ptr_void_ptr_size_t)0x2e) {
          if ((digi_table[(byte)p_Var54[2]] & 3) == 0) {
            local_460 = "no digit after decimal point";
            p_Var49 = p_Var54 + 2;
            local_4b0 = p_Var54 + 2;
            local_4a8 = pre;
            local_488 = uVar31;
            local_480 = val;
            goto LAB_01b97ddb;
          }
          local_498 = (_func_void_ptr_void_ptr_size_t *)(cur + uVar52 + 1);
          do {
            p_Var49 = local_498;
            uVar30 = (ulong)(byte)p_Var49[1];
            local_498 = p_Var49 + 1;
          } while (uVar30 == 0x30);
          bVar32 = digi_table[uVar30];
          if ((bVar32 & 3) != 0) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 - 0x30);
            goto LAB_01b993bf;
          }
        }
        if ((bVar32 & 3) == 0) {
          if ((bVar32 & 0x20) != 0) {
            bVar26 = (digi_table[(byte)local_498[1]] & 0xc) == 0;
            p_Var49 = local_498 + (2 - (ulong)bVar26);
            local_498 = local_498 + (2 - (ulong)bVar26);
            if ((digi_table[(byte)*p_Var49] & 3) == 0) {
              local_460 = "no digit after exponent sign";
              p_Var49 = local_498;
              local_4b0 = local_498;
              local_4a8 = pre;
              local_488 = uVar31;
              local_480 = val;
              goto LAB_01b97ddb;
            }
            do {
              pcVar1 = local_498 + 1;
              local_498 = local_498 + 1;
            } while ((digi_table[(byte)*pcVar1] & 3) != 0);
          }
          pyVar27[1].root = (yyjson_val *)0x14;
          pyVar27[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar42 == 0x2d) << 0x3f);
          local_4b0 = local_498;
          local_4a8 = pre;
          local_488 = uVar31;
          local_480 = val;
          goto LAB_01b977ae;
        }
        local_460 = "number with leading zero is not allowed";
        p_Var49 = local_498 + -1;
        local_4b0 = local_498 + -1;
        local_4a8 = pre;
        local_488 = uVar31;
        local_480 = val;
      }
      else {
        if ((flg & 0x10) != 0) {
          p_Var49 = p_Var54 + -(ulong)(bVar42 == 0x2d);
          if (uVar30 == 0x49) {
LAB_01b99b13:
            if ((((byte)p_Var54[1] | 0x20) == 0x6e) && (((byte)p_Var54[2] | 0x20) == 0x66)) {
              local_4b0 = p_Var54 + 3;
              if ((((((byte)p_Var54[3] | 0x20) == 0x69) && (((byte)p_Var54[4] | 0x20) == 0x6e)) &&
                  (((byte)p_Var54[5] | 0x20) == 0x69)) &&
                 ((((byte)p_Var54[6] | 0x20) == 0x74 && (((byte)p_Var54[7] | 0x20) == 0x79)))) {
                local_4b0 = p_Var54 + 8;
              }
              if ((flg & 0xa0) == 0) {
                pyVar27[1].root = (yyjson_val *)0x14;
                pyVar27[1].alc.malloc =
                     (_func_void_ptr_void_ptr_size_t *)
                     (((ulong)(bVar42 != 0x2d) << 0x3f) + -0x10000000000000);
                local_4a8 = pre;
              }
              else {
                if (*pre != (u8 *)0x0) {
                  **pre = '\0';
                }
                *pre = (u8 *)local_4b0;
                pyVar27[1].root = (yyjson_val *)(((long)local_4b0 - (long)p_Var49) * 0x100 + 1);
                pyVar27[1].alc.malloc = p_Var49;
                local_4a8 = pre;
              }
              goto LAB_01b977ae;
            }
            if ((bVar32 | 0x20) != 0x6e) goto LAB_01b9931c;
          }
          else if ((bVar32 != 0x4e) && (bVar32 != 0x6e)) {
            if (bVar32 != 0x69) goto LAB_01b9931c;
            goto LAB_01b99b13;
          }
          if ((((byte)p_Var54[1] | 0x20) == 0x61) && (((byte)p_Var54[2] | 0x20) == 0x6e)) {
            local_4b0 = p_Var54 + 3;
            if ((flg & 0xa0) == 0) {
              pyVar27[1].root = (yyjson_val *)0x14;
              pyVar27[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)
                   (((ulong)(bVar42 != 0x2d) << 0x3f) + -0x8000000000000);
              local_4a8 = pre;
            }
            else {
              if (*pre != (u8 *)0x0) {
                **pre = '\0';
              }
              *pre = (u8 *)local_4b0;
              pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 0x100 + 0x301);
              pyVar27[1].alc.malloc = p_Var49;
              local_4a8 = pre;
            }
            goto LAB_01b977ae;
          }
        }
LAB_01b9931c:
        local_460 = "no digit after minus sign";
        p_Var49 = p_Var54;
        local_4b0 = p_Var54;
        local_4a8 = pre;
      }
LAB_01b97ddb:
      puVar24 = local_490;
      p_Var54 = local_4a0;
      bVar26 = is_truncated_end(local_490,(u8 *)p_Var49,(u8 *)local_4a0,9,flg);
      if (bVar26) {
        p_Var49 = p_Var54;
      }
      pcVar35 = "unexpected end of data";
      if (!bVar26) {
        pcVar35 = local_460;
      }
      local_458->pos = (long)p_Var49 - (long)puVar24;
      local_458->code = (uint)!bVar26 * 4 + 5;
      local_458->msg = pcVar35;
      (*alc.free)(alc.ctx,pyVar27);
      goto LAB_01b97e36;
    }
    p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 - 0x30);
    cVar33 = p_Var54[1];
    uVar52 = (ulong)(byte)cVar33 - 0x30;
    if (uVar52 < 10) {
      p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar52 + (long)p_Var50 * 10);
      cVar33 = p_Var54[2];
      uVar30 = (ulong)(byte)cVar33 - 0x30;
      if (uVar30 < 10) {
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[3];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 3;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) {
LAB_01b982b4:
            pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
            p_Var49 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var50;
            if (bVar42 != 0x2d) {
              p_Var49 = p_Var50;
            }
            goto LAB_01b98302;
          }
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b9941e:
          cVar33 = p_Var54[4];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b9943b;
          }
          p_Var49 = p_Var54 + 4;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[4];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 4;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) {
LAB_01b982e3:
            pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
            p_Var49 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var50;
            if (bVar42 != 0x2d) {
              p_Var49 = p_Var50;
            }
            goto LAB_01b98302;
          }
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b9943b:
          cVar33 = p_Var54[5];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99458;
          }
          p_Var49 = p_Var54 + 5;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[5];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 5;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99458:
          cVar33 = p_Var54[6];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99475;
          }
          p_Var49 = p_Var54 + 6;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[6];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 6;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99475:
          cVar33 = p_Var54[7];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99492;
          }
          p_Var49 = p_Var54 + 7;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[7];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 7;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99492:
          cVar33 = p_Var54[8];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b994af;
          }
          p_Var49 = p_Var54 + 8;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[8];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 8;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b994af:
          cVar33 = p_Var54[9];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b994cc;
          }
          p_Var49 = p_Var54 + 9;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[9];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 9;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b994cc:
          cVar33 = p_Var54[10];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b994e9;
          }
          p_Var49 = p_Var54 + 10;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[10];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 10;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b994e9:
          cVar33 = p_Var54[0xb];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99506;
          }
          p_Var49 = p_Var54 + 0xb;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0xb];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0xb;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99506:
          cVar33 = p_Var54[0xc];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99523;
          }
          p_Var49 = p_Var54 + 0xc;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0xc];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0xc;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99523:
          cVar33 = p_Var54[0xd];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99540;
          }
          p_Var49 = p_Var54 + 0xd;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0xd];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0xd;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99540:
          cVar33 = p_Var54[0xe];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b9955d;
          }
          p_Var49 = p_Var54 + 0xe;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0xe];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0xe;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b9955d:
          cVar33 = p_Var54[0xf];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b9957a;
          }
          p_Var49 = p_Var54 + 0xf;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0xf];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0xf;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b9957a:
          cVar33 = p_Var54[0x10];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b99597;
          }
          p_Var49 = p_Var54 + 0x10;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0x10];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0x10;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99597:
          cVar33 = p_Var54[0x11];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b995b4;
          }
          p_Var49 = p_Var54 + 0x11;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0x11];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0x11;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982b4;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b995b4:
          cVar33 = p_Var54[0x12];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            goto LAB_01b995d1;
          }
          p_Var49 = p_Var54 + 0x12;
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        cVar33 = p_Var54[0x12];
        uVar30 = (ulong)(byte)cVar33 - 0x30;
        if (9 < uVar30) {
          p_Var38 = p_Var54 + 0x12;
          if ((digi_table[(byte)cVar33] & 0x30) == 0) goto LAB_01b982e3;
          local_498 = p_Var38;
          if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b995d1:
          cVar33 = p_Var54[0x13];
          if ((ulong)(byte)cVar33 - 0x30 < 10) {
            p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                      (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
            cVar33 = p_Var54[0x14];
            p_Var49 = p_Var54 + 0x14;
            p_Var38 = local_498;
            if ((digi_table[(byte)cVar33] & 3) != 0) goto LAB_01b978bc;
          }
          else {
            p_Var49 = p_Var54 + 0x13;
          }
          goto LAB_01b99609;
        }
        p_Var50 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
        p_Var38 = p_Var54 + 0x13;
        cVar33 = p_Var54[0x13];
        bVar32 = digi_table[(byte)cVar33];
        if ((bVar32 & 0x33) == 0) {
          local_4b0 = p_Var38;
          if ((bVar42 == 0x2d) && ((_func_void_ptr_void_ptr_size_t *)0x8000000000000000 < p_Var50))
          {
            if (cVar56 < '\0') {
              if (*pre != (u8 *)0x0) {
                **pre = '\0';
              }
              pyVar27[1].root = (yyjson_val *)(((long)p_Var38 - (long)cur) * 0x100 + 1);
              pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
              *pre = (u8 *)p_Var38;
              local_4a8 = pre;
            }
            else {
              auVar57._8_4_ = (int)((ulong)p_Var50 >> 0x20);
              auVar57._0_8_ = p_Var50;
              auVar57._12_4_ = 0x45300000;
              pyVar27[1].root = (yyjson_val *)0x14;
              pyVar27[1].alc.malloc =
                   (_func_void_ptr_void_ptr_size_t *)
                   -((auVar57._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)p_Var50) - 4503599627370496.0));
              local_4a8 = pre;
            }
          }
          else {
            p_Var49 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var50;
            if (bVar42 != 0x2d) {
              p_Var49 = p_Var50;
            }
            pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
            pyVar27[1].alc.malloc = p_Var49;
            local_4a8 = pre;
          }
          goto LAB_01b977ae;
        }
        if (((bVar32 & 3) != 0) && ((digi_table[(byte)p_Var54[0x14]] & 0x33) == 0)) {
          uVar30 = (ulong)(byte)cVar33 - 0x30;
          if ((p_Var50 < (_func_void_ptr_void_ptr_size_t *)0x1999999999999999) ||
             ((p_Var50 == (_func_void_ptr_void_ptr_size_t *)0x1999999999999999 && (uVar30 < 6)))) {
            local_4b0 = p_Var54 + 0x14;
            p_Var49 = (_func_void_ptr_void_ptr_size_t *)(uVar30 + (long)p_Var50 * 10);
            if (bVar42 == 0x2d) {
              if (cVar56 < '\0') {
                if (*pre != (u8 *)0x0) {
                  **pre = '\0';
                }
                pyVar27[1].root = (yyjson_val *)(((long)local_4b0 - (long)cur) * 0x100 + 1);
                pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
                *pre = (u8 *)local_4b0;
                local_4a8 = pre;
              }
              else {
                auVar58._8_4_ = (int)((ulong)p_Var49 >> 0x20);
                auVar58._0_8_ = p_Var49;
                auVar58._12_4_ = 0x45300000;
                pyVar27[1].root = (yyjson_val *)0x14;
                pyVar27[1].alc.malloc =
                     (_func_void_ptr_void_ptr_size_t *)
                     -((auVar58._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)p_Var49) - 4503599627370496.0));
                local_4a8 = pre;
              }
            }
            else {
              pyVar27[1].root = (yyjson_val *)0x4;
              pyVar27[1].alc.malloc = p_Var49;
              local_4a8 = pre;
            }
            goto LAB_01b977ae;
          }
        }
        p_Var53 = (_func_void_ptr_void_ptr_size_t *)0x0;
        if ((bVar32 & 0x20) != 0) {
          local_478 = (_func_void_ptr_void_ptr_size_t *)0x0;
          p_Var54 = (_func_void_ptr_void_ptr_size_t *)0x0;
          local_498 = p_Var38;
          goto LAB_01b979f3;
        }
        if (cVar33 == (code)0x2e) {
          cVar33 = p_Var54[0x14];
          p_Var49 = p_Var54 + 0x14;
          if ((digi_table[(byte)cVar33] & 3) == 0) {
            local_460 = "no digit after decimal point";
            local_4b0 = p_Var49;
            local_4a8 = pre;
            local_480 = val;
            goto LAB_01b97ddb;
          }
        }
        else {
          local_498 = (_func_void_ptr_void_ptr_size_t *)0x0;
          p_Var49 = p_Var38;
          p_Var38 = local_498;
        }
LAB_01b978bc:
        local_498 = p_Var38;
        pyVar47 = (yyjson_val *)((long)p_Var49 * 0x100 + (long)cur * -0x100 + 1);
        p_Var54 = p_Var49 + 1;
        do {
          p_Var53 = p_Var54;
          bVar32 = digi_table[(byte)*p_Var53];
          p_Var54 = p_Var53 + 1;
          pyVar47 = pyVar47 + 0x10;
        } while ((bVar32 & 3) != 0);
        p_Var38 = p_Var53;
        p_Var45 = local_498;
        if (local_498 == (_func_void_ptr_void_ptr_size_t *)0x0) {
          if ((cVar56 < '\0') && ((bVar32 & 0x30) == 0)) {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            pyVar27[1].root = pyVar47;
            pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
            *pre = (u8 *)p_Var53;
            local_4b0 = p_Var53;
            local_4a8 = pre;
            local_488 = uVar31;
            local_480 = val;
            goto LAB_01b977ae;
          }
          p_Var45 = p_Var53;
          if (*p_Var53 == (_func_void_ptr_void_ptr_size_t)0x2e) {
            if ((digi_table[(byte)*p_Var54] & 3) == 0) {
              local_460 = "no digit after decimal point";
              p_Var49 = p_Var54;
              local_4b0 = p_Var54;
              local_4a8 = pre;
              local_488 = uVar31;
              local_480 = val;
              goto LAB_01b97ddb;
            }
            do {
              p_Var38 = p_Var53 + 1;
              bVar32 = digi_table[(byte)p_Var53[1]];
              p_Var53 = p_Var38;
            } while ((bVar32 & 3) != 0);
          }
        }
        local_498 = p_Var45;
        p_Var50 = p_Var50 + (0x34 < (byte)cVar33);
        p_Var45 = p_Var38;
        do {
          do {
            p_Var45 = p_Var45 + -1;
          } while (*p_Var45 == (_func_void_ptr_void_ptr_size_t)0x30);
        } while (*p_Var45 == (_func_void_ptr_void_ptr_size_t)0x2e);
        p_Var53 = local_498 + ((ulong)(local_498 < p_Var49) - (long)p_Var49);
        p_Var54 = p_Var49;
        local_478 = p_Var38;
        if (p_Var45 < p_Var49) {
          p_Var54 = (_func_void_ptr_void_ptr_size_t *)0x0;
          local_478 = (_func_void_ptr_void_ptr_size_t *)0x0;
        }
        local_488 = uVar31;
        if ((bVar32 & 0x20) != 0) goto LAB_01b979f3;
LAB_01b97aab:
        if ((long)p_Var53 < -0x157) {
          pyVar27[1].root = (yyjson_val *)0x14;
          pyVar27[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar42 == 0x2d) << 0x3f);
          local_4b0 = p_Var38;
          local_4a8 = pre;
          local_480 = val;
        }
        else {
          p_Var49 = p_Var38;
          if ((long)p_Var53 < 0x135) goto LAB_01b97ac5;
          if (cVar56 < '\0') {
            if (*pre != (u8 *)0x0) {
              **pre = '\0';
            }
            pyVar27[1].root = (yyjson_val *)(((long)p_Var38 - (long)cur) * 0x100 + 1);
            pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
            *pre = (u8 *)p_Var38;
            local_4b0 = p_Var38;
            local_4a8 = pre;
            local_480 = val;
          }
          else {
            if ((flg & 0x10) == 0) {
              local_460 = "number is infinity when parsed as double";
              p_Var49 = (_func_void_ptr_void_ptr_size_t *)cur;
              local_4a8 = pre;
              local_480 = val;
              goto LAB_01b97ddb;
            }
            pyVar27[1].root = (yyjson_val *)0x14;
            pyVar27[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)
                 (((ulong)(bVar42 != 0x2d) << 0x3f) + -0x10000000000000);
            local_4b0 = p_Var38;
            local_4a8 = pre;
            local_480 = val;
          }
        }
      }
      else {
        p_Var38 = p_Var54 + 2;
        if ((digi_table[(byte)cVar33] & 0x30) == 0) {
          pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
          p_Var49 = (_func_void_ptr_void_ptr_size_t *)-(long)p_Var50;
          if (bVar42 != 0x2d) {
            p_Var49 = p_Var50;
          }
LAB_01b98302:
          pyVar27[1].alc.malloc = p_Var49;
          local_4b0 = p_Var38;
          local_4a8 = pre;
          goto LAB_01b977ae;
        }
        local_498 = p_Var38;
        if (cVar33 != (code)0x2e) goto LAB_01b99a3f;
LAB_01b99401:
        cVar33 = p_Var54[3];
        if ((ulong)(byte)cVar33 - 0x30 < 10) {
          p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                    (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
          goto LAB_01b9941e;
        }
        p_Var49 = p_Var54 + 3;
LAB_01b99609:
        if (local_498 + 1 == p_Var49) {
          local_460 = "no digit after decimal point";
          local_4b0 = p_Var49;
          local_4a8 = pre;
          local_488 = uVar31;
          local_480 = val;
          goto LAB_01b97ddb;
        }
        p_Var53 = local_498 + (1 - (long)p_Var49);
        p_Var38 = p_Var49;
        if ((digi_table[(byte)cVar33] & 0x20) != 0) goto LAB_01b99a80;
        if ((long)p_Var53 < -0x157) {
          pyVar27[1].root = (yyjson_val *)0x14;
          pyVar27[1].alc.malloc =
               (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar42 == 0x2d) << 0x3f);
          local_4b0 = p_Var49;
          local_4a8 = pre;
          local_488 = uVar31;
          local_480 = val;
          goto LAB_01b977ae;
        }
        p_Var54 = (_func_void_ptr_void_ptr_size_t *)0x0;
        local_488 = uVar31;
        local_478 = p_Var49;
LAB_01b97ac5:
        exp = (i32)p_Var53;
        if (((ulong)p_Var50 >> 0x35 == 0) && (exp + 0x16U < 0x2d)) {
          if (exp < 0) {
            p_Var54 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var50 / *(double *)(f64_pow10_table + (ulong)(uint)-exp * 8))
            ;
          }
          else {
            p_Var54 = (_func_void_ptr_void_ptr_size_t *)
                      ((double)(long)p_Var50 *
                      *(double *)(f64_pow10_table + (ulong)(exp & 0x7fffffff) * 8));
          }
          pyVar27[1].root = (yyjson_val *)0x14;
          if (bVar42 == 0x2d) {
            p_Var54 = (_func_void_ptr_void_ptr_size_t *)((ulong)p_Var54 ^ 0x8000000000000000);
          }
          pyVar27[1].alc.malloc = p_Var54;
          local_4b0 = p_Var49;
          local_4a8 = pre;
          local_480 = val;
          goto LAB_01b977ae;
        }
        if ((exp + 0x132U < 0x252) && (p_Var54 == (_func_void_ptr_void_ptr_size_t *)0x0)) {
          lVar28 = (long)(exp * 2 + 0x2ae);
          uVar30 = 0x3f;
          if (p_Var50 != (_func_void_ptr_void_ptr_size_t *)0x0) {
            for (; (ulong)p_Var50 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          iVar43 = (int)(uVar30 ^ 0x3f);
          uVar52 = (long)p_Var50 << ((byte)(uVar30 ^ 0x3f) & 0x3f);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = uVar52;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)(pow10_sig_table + lVar28 * 8);
          auVar4 = auVar4 * auVar9;
          lVar51 = auVar4._8_8_;
          uVar30 = auVar4._0_8_;
          iVar36 = exp * 0x3526a + -0x3f0000 >> 0x10;
          if (0x1fd < (ulong)(auVar4._8_4_ & 0x1ff) - 1) {
            lVar48 = (long)(exp * 2 + 0x2af);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar52;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = *(ulong *)(pow10_sig_table + lVar48 * 8);
            lVar34 = SUB168(auVar5 * auVar10,8);
            if (0xfffffffffffffffd < (lVar34 + uVar30) - 1) goto LAB_01b97c5c;
            lVar51 = lVar51 + (ulong)(lVar34 + uVar30 < uVar30);
          }
          uVar30 = lVar51 << (-1 < lVar51);
          uVar30 = (uVar30 & 0x400) + uVar30;
          pyVar27[1].root = (yyjson_val *)0x14;
          p_Var54 = (_func_void_ptr_void_ptr_size_t *)
                    ((ulong)(bVar42 == 0x2d) << 0x3f |
                    uVar30 >> 0xb & 0xfffffffffffff |
                    (ulong)(((iVar36 - iVar43) - (uint)(-1 < lVar51)) + 0x47e +
                           (uint)(uVar30 < 0x400)) << 0x34);
          local_4a8 = pre;
          local_488 = uVar31;
          local_480 = val;
          local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
LAB_01b97c07:
          pyVar27[1].alc.malloc = p_Var54;
          pre = local_4a8;
          val = local_480;
          local_4b0 = p_Var49;
        }
        else {
          uVar30 = 0x3f;
          if (p_Var50 != (_func_void_ptr_void_ptr_size_t *)0x0) {
            for (; (ulong)p_Var50 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          iVar43 = (int)(uVar30 ^ 0x3f);
          uVar52 = (long)p_Var50 << ((byte)(uVar30 ^ 0x3f) & 0x3f);
          lVar28 = (long)(exp * 2 + 0x2ae);
          lVar48 = (long)(exp * 2 + 0x2af);
          iVar36 = exp * 0x3526a + -0x3f0000 >> 0x10;
LAB_01b97c5c:
          lVar51 = ((ulong)(p_Var54 != (_func_void_ptr_void_ptr_size_t *)0x0) << 2) <<
                   ((byte)iVar43 & 0x3f);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = uVar52;
          auVar11._8_8_ = 0;
          auVar11._0_8_ =
               *(long *)(pow10_sig_table + lVar28 * 8) -
               (*(long *)(pow10_sig_table + lVar48 * 8) >> 0x3f);
          uVar52 = SUB168(auVar6 * auVar11,8) - (SUB168(auVar6 * auVar11,0) >> 0x3f);
          uVar30 = 0x3f;
          if (uVar52 != 0) {
            for (; uVar52 >> uVar30 == 0; uVar30 = uVar30 - 1) {
            }
          }
          bVar32 = (byte)(uVar30 ^ 0x3f);
          uVar52 = uVar52 << (bVar32 & 0x3f);
          uVar37 = ((iVar36 - (int)(uVar30 ^ 0x3f)) - iVar43) + 0x40;
          uVar30 = (9 - (ulong)(lVar51 == 0)) + lVar51 << (bVar32 & 0x3f);
          if ((int)uVar37 < -0x43d) {
            if (uVar37 < 0xfffffb8f) {
              iVar36 = 0x40;
            }
            else {
              iVar36 = -0x432 - uVar37;
              if (0xfffffb91 < uVar37) goto LAB_01b97ccc;
            }
            bVar32 = (char)iVar36 - 0x3c;
            uVar52 = uVar52 >> (bVar32 & 0x3f);
            uVar37 = (uVar37 + iVar36) - 0x3c;
            uVar30 = (uVar30 >> (bVar32 & 0x3f)) + 9;
            iVar36 = 0x3c;
          }
          else {
            iVar36 = 0xb;
          }
LAB_01b97ccc:
          bVar32 = (byte)iVar36;
          uVar46 = (~(-1L << (bVar32 & 0x3f)) & uVar52) * 8;
          lVar28 = 8L << (bVar32 - 1 & 0x3f);
          uVar40 = lVar28 + uVar30;
          uVar52 = (ulong)(uVar40 <= uVar46) + (uVar52 >> (bVar32 & 0x3f));
          if (uVar52 == 0) {
LAB_01b98773:
            uVar52 = 0;
LAB_01b97d5c:
            if ((lVar28 - uVar30 < uVar46) && (uVar46 < uVar40)) {
              uVar37 = 0xfffffbcd;
              if (0xfffffffffffff < uVar52) {
                uVar37 = (uint)(uVar52 >> 0x34) - 0x434;
              }
              uVar30 = (uVar52 & 0xfffffffffffff) + 0x10000000000000;
              if (0xfffffffffffff >= uVar52) {
                uVar30 = uVar52;
              }
              local_4a8 = pre;
              local_488 = uVar31;
              local_480 = val;
              local_470 = pyVar27;
              local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
              bigint_set_buf(&big_full,(u64)p_Var50,&exp,(u8 *)p_Var54,(u8 *)local_478,
                             (u8 *)local_498);
              local_230[0] = uVar30 * 2 + 1;
              iVar36 = exp;
              if (exp < 0) {
                uVar39 = 1;
                for (iVar36 = -exp; uVar31 = (ulong)uVar39, 0x12 < iVar36; iVar36 = iVar36 + -0x13)
                {
                  for (uVar30 = 0;
                      (uVar40 = uVar31, uVar31 != uVar30 &&
                      (uVar40 = uVar30, *(long *)((long)local_238 + (uVar30 + 1) * 8) == 0));
                      uVar30 = uVar30 + 1) {
                  }
                  uVar30 = 0;
                  for (; auVar18._8_8_ = 0, auVar18._0_8_ = uVar30, uVar40 < uVar31;
                      uVar40 = uVar40 + 1) {
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = *(ulong *)((long)local_238 + (uVar40 + 1) * 8);
                    auVar18 = ZEXT816(10000000000000000000) * auVar13 + auVar18;
                    uVar30 = auVar18._8_8_;
                    *(long *)((long)local_238 + (uVar40 + 1) * 8) = auVar18._0_8_;
                  }
                  if (uVar30 != 0) {
                    uVar39 = uVar39 + 1;
                    *(ulong *)((long)local_238 + (uVar31 + 1) * 8) = uVar30;
                  }
                }
                if (iVar36 != 0) {
                  uVar30 = *(ulong *)(u64_pow10_table + (long)iVar36 * 8);
                  for (uVar40 = 0;
                      (uVar46 = uVar31, uVar31 != uVar40 &&
                      (uVar46 = uVar40, *(long *)((long)local_238 + (uVar40 + 1) * 8) == 0));
                      uVar40 = uVar40 + 1) {
                  }
                  uVar40 = 0;
                  for (; auVar20._8_8_ = 0, auVar20._0_8_ = uVar40, uVar46 < uVar31;
                      uVar46 = uVar46 + 1) {
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = uVar30;
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = *(ulong *)((long)local_238 + (uVar46 + 1) * 8);
                    auVar20 = auVar8 * auVar15 + auVar20;
                    uVar40 = auVar20._8_8_;
                    *(long *)((long)local_238 + (uVar46 + 1) * 8) = auVar20._0_8_;
                  }
                  if (uVar40 != 0) {
                    uVar39 = uVar39 + 1;
                    local_238[0] = uVar39;
                    *(ulong *)((long)local_238 + (uVar31 + 1) * 8) = uVar40;
                  }
                }
              }
              else {
                for (; uVar31 = (ulong)big_full.used, 0x12 < iVar36; iVar36 = iVar36 + -0x13) {
                  for (uVar30 = 0;
                      (uVar40 = uVar31, uVar31 != uVar30 &&
                      (uVar40 = uVar30, big_full.bits[uVar30] == 0)); uVar30 = uVar30 + 1) {
                  }
                  uVar30 = 0;
                  for (; auVar17._8_8_ = 0, auVar17._0_8_ = uVar30, uVar40 < uVar31;
                      uVar40 = uVar40 + 1) {
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = big_full.bits[uVar40];
                    auVar17 = ZEXT816(10000000000000000000) * auVar12 + auVar17;
                    uVar30 = auVar17._8_8_;
                    big_full.bits[uVar40] = auVar17._0_8_;
                  }
                  if (uVar30 != 0) {
                    big_full.used = big_full.used + 1;
                    big_full.bits[uVar31] = uVar30;
                  }
                }
                uVar39 = 1;
                if (iVar36 != 0) {
                  uVar30 = *(ulong *)(u64_pow10_table + (long)iVar36 * 8);
                  for (uVar40 = 0;
                      (uVar46 = uVar31, uVar31 != uVar40 &&
                      (uVar46 = uVar40, big_full.bits[uVar40] == 0)); uVar40 = uVar40 + 1) {
                  }
                  uVar40 = 0;
                  for (; auVar19._8_8_ = 0, auVar19._0_8_ = uVar40, uVar46 < uVar31;
                      uVar46 = uVar46 + 1) {
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = uVar30;
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = big_full.bits[uVar46];
                    auVar19 = auVar7 * auVar14 + auVar19;
                    uVar40 = auVar19._8_8_;
                    big_full.bits[uVar46] = auVar19._0_8_;
                  }
                  if (uVar40 != 0) {
                    big_full.used = big_full.used + 1;
                    big_full.bits[uVar31] = uVar40;
                  }
                }
              }
              if ((int)uVar37 < 1) {
                uVar44 = -uVar37 >> 6;
                uVar31 = (ulong)uVar44;
                uVar30 = (ulong)big_full.used;
                uVar37 = -uVar37 & 0x3f;
                if (uVar37 == 0) {
                  while (uVar30 != 0) {
                    big_full.bits[(int)uVar30 + (uVar44 - 1)] = big_full.bits[uVar30 - 1];
                    uVar30 = uVar30 - 1;
                  }
                  big_full.used = big_full.used + uVar44;
                  while (uVar31 != 0) {
                    big_full.bits[uVar31 - 1] = 0;
                    uVar31 = uVar31 - 1;
                  }
                }
                else {
                  big_full.bits[uVar30] = 0;
                  sVar21 = (sbyte)uVar37;
                  uVar37 = big_full.used + uVar44;
                  while (uVar40 = uVar30 - 1, uVar40 != 0xffffffffffffffff) {
                    big_full.bits[uVar37] =
                         big_full.bits[uVar40 & 0xffffffff] >> (0x40U - sVar21 & 0x3f) |
                         big_full.bits[uVar30] << sVar21;
                    uVar37 = uVar37 - 1;
                    uVar30 = uVar40;
                  }
                  big_full.bits[uVar31] = big_full.bits[0] << sVar21;
                  big_full.used =
                       (big_full.used + uVar44 + 1) -
                       (uint)(big_full.bits[big_full.used + uVar44] == 0);
                  while (uVar31 != 0) {
                    big_full.bits[uVar31 - 1] = 0;
                    uVar31 = uVar31 - 1;
                  }
                }
              }
              else {
                uVar44 = uVar37 >> 6;
                uVar31 = (ulong)uVar44;
                uVar30 = (ulong)uVar39;
                if ((uVar37 & 0x3f) == 0) {
                  while (uVar30 != 0) {
                    *(undefined8 *)((long)local_238 + ((ulong)((int)uVar30 + (uVar44 - 1)) + 1) * 8)
                         = *(undefined8 *)((long)local_238 + uVar30 * 8);
                    uVar30 = uVar30 - 1;
                  }
                  uVar39 = uVar39 + uVar44;
                  while (uVar31 != 0) {
                    *(undefined8 *)((long)local_238 + uVar31 * 8) = 0;
                    uVar31 = uVar31 - 1;
                  }
                }
                else {
                  *(undefined8 *)((long)local_238 + (uVar30 + 1) * 8) = 0;
                  sVar21 = (sbyte)(uVar37 & 0x3f);
                  uVar37 = uVar39 + uVar44;
                  while (uVar40 = uVar30 - 1, uVar40 != 0xffffffffffffffff) {
                    *(ulong *)((long)local_238 + ((ulong)uVar37 + 1) * 8) =
                         *(ulong *)((long)local_238 + ((uVar40 & 0xffffffff) + 1) * 8) >>
                         (0x40U - sVar21 & 0x3f) |
                         *(long *)((long)local_238 + (uVar30 + 1) * 8) << sVar21;
                    uVar37 = uVar37 - 1;
                    uVar30 = uVar40;
                  }
                  *(long *)((long)local_238 + (uVar31 + 1) * 8) = local_230[0] << sVar21;
                  uVar39 = (uVar39 + uVar44 + 1) -
                           (uint)(*(long *)((long)local_238 + ((ulong)(uVar39 + uVar44) + 1) * 8) ==
                                 0);
                  while (uVar31 != 0) {
                    *(undefined8 *)((long)local_238 + uVar31 * 8) = 0;
                    uVar31 = uVar31 - 1;
                  }
                }
              }
              uVar31 = (ulong)big_full.used;
              if (big_full.used < uVar39) {
LAB_01b998de:
                uVar30 = 0;
              }
              else {
                uVar30 = 1;
                if (big_full.used <= uVar39) {
                  do {
                    if (uVar31 == 0) {
                      uVar30 = (ulong)((uint)uVar52 & 1);
                      break;
                    }
                    puVar2 = (ulong *)((long)local_238 + uVar31 * 8);
                    lVar28 = uVar31 - 1;
                    if (big_full.bits[lVar28] < *puVar2) goto LAB_01b998de;
                    uVar31 = uVar31 - 1;
                  } while (big_full.bits[lVar28] <= *puVar2);
                }
              }
              p_Var54 = (_func_void_ptr_void_ptr_size_t *)0x7ff0000000000000;
              if (uVar30 + uVar52 == 0x7ff0000000000000) {
                uVar31 = local_488;
                if (-1 < cVar56) {
                  if ((flg & 0x10) != 0) {
                    local_470[1].root = (yyjson_val *)0x14;
                    if ((int)local_488 == 0x2d) {
                      p_Var54 = (_func_void_ptr_void_ptr_size_t *)0xfff0000000000000;
                    }
                    goto LAB_01b9982b;
                  }
                  goto LAB_01b98642;
                }
                goto LAB_01b9997a;
              }
              local_470[1].root = (yyjson_val *)0x14;
              p_Var54 = (_func_void_ptr_void_ptr_size_t *)
                        (uVar30 + uVar52 | (ulong)((int)local_488 == 0x2d) << 0x3f);
              pyVar27 = local_470;
              goto LAB_01b97c07;
            }
            pyVar27[1].root = (yyjson_val *)0x14;
            pyVar27[1].alc.malloc =
                 (_func_void_ptr_void_ptr_size_t *)(uVar52 | (ulong)(bVar42 == 0x2d) << 0x3f);
            local_4b0 = p_Var49;
            local_4a8 = pre;
            local_488 = uVar31;
            local_480 = val;
            local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
          }
          else {
            uVar3 = 0x3f;
            if (uVar52 != 0) {
              for (; uVar52 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            uVar37 = (uVar37 + iVar36) - (int)(uVar3 ^ 0x3f);
            if ((int)uVar37 < 0x3c1) {
              uVar52 = (uVar52 << ((byte)(uVar3 ^ 0x3f) & 0x3f)) >> 0xb;
              if ((int)uVar37 < -0x43d) {
                if (uVar37 < 0xfffffb8f) goto LAB_01b98773;
                uVar52 = uVar52 >> (-(char)uVar37 - 0x3dU & 0x3f);
              }
              else {
                uVar52 = uVar52 & 0xfffffffffffff | (ulong)(uVar37 + 0x43e) << 0x34;
                if (uVar52 == 0x7ff0000000000000) goto LAB_01b98627;
              }
              goto LAB_01b97d5c;
            }
LAB_01b98627:
            local_4a8 = pre;
            local_480 = val;
            local_470 = pyVar27;
            local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
            if (cVar56 < '\0') {
LAB_01b9997a:
              local_488 = uVar31;
              if (*local_4a8 != (u8 *)0x0) {
                **local_4a8 = '\0';
              }
              local_470[1].root = (yyjson_val *)(((long)p_Var49 - (long)local_468) * 0x100 + 1);
              local_470[1].alc.malloc = local_468;
              *local_4a8 = (u8 *)p_Var49;
              pyVar27 = local_470;
              pre = local_4a8;
              val = local_480;
              local_4b0 = p_Var49;
            }
            else {
              if ((flg & 0x10) == 0) {
LAB_01b98642:
                local_488 = uVar31;
                local_460 = "number is infinity when parsed as double";
                pyVar27 = local_470;
                p_Var49 = local_468;
                local_4b0 = local_468;
                goto LAB_01b97ddb;
              }
              pyVar27[1].root = (yyjson_val *)0x14;
              p_Var54 = (_func_void_ptr_void_ptr_size_t *)
                        (((ulong)(bVar42 != 0x2d) << 0x3f) + -0x10000000000000);
              local_488 = uVar31;
LAB_01b9982b:
              local_470[1].alc.malloc = p_Var54;
              pyVar27 = local_470;
              pre = local_4a8;
              val = local_480;
              local_4b0 = p_Var49;
            }
          }
        }
      }
    }
    else {
      p_Var38 = p_Var54 + 1;
      if ((digi_table[(byte)cVar33] & 0x30) == 0) {
        pyVar27[1].root = (yyjson_val *)((ulong)(bVar42 == 0x2d) * 8 + 4);
        if (bVar42 == 0x2d) {
          p_Var50 = (_func_void_ptr_void_ptr_size_t *)(0x30 - uVar30);
        }
        pyVar27[1].alc.malloc = p_Var50;
        local_4b0 = p_Var38;
        local_4a8 = pre;
        goto LAB_01b977ae;
      }
      p_Var49 = p_Var54;
      if (cVar33 == (code)0x2e) {
LAB_01b993bf:
        local_498 = p_Var54 + 1;
        cVar33 = p_Var49[2];
        if ((ulong)(byte)cVar33 - 0x30 < 10) {
          p_Var50 = (_func_void_ptr_void_ptr_size_t *)
                    (((ulong)(byte)cVar33 - 0x30) + (long)p_Var50 * 10);
          p_Var54 = p_Var49;
          goto LAB_01b99401;
        }
        p_Var49 = p_Var49 + 2;
        goto LAB_01b99609;
      }
LAB_01b99a3f:
      p_Var53 = (_func_void_ptr_void_ptr_size_t *)0x0;
      local_498 = p_Var38;
LAB_01b99a80:
      p_Var54 = (_func_void_ptr_void_ptr_size_t *)0x0;
      local_488 = uVar31;
      local_478 = p_Var38;
LAB_01b979f3:
      cVar33 = p_Var38[1];
      uVar30 = (ulong)((digi_table[(byte)cVar33] & 0xc) != 0);
      if ((digi_table[(byte)p_Var38[uVar30 + 1]] & 3) == 0) {
        p_Var49 = p_Var38 + uVar30 + 1;
        local_460 = "no digit after exponent sign";
        local_4b0 = p_Var49;
        local_4a8 = pre;
        local_480 = val;
        goto LAB_01b97ddb;
      }
      p_Var38 = p_Var38 + uVar30;
      pyVar47 = (yyjson_val *)((long)p_Var38 * 0x100 + (long)cur * -0x100 + 1);
      do {
        cVar41 = p_Var38[1];
        p_Var38 = p_Var38 + 1;
        pyVar47 = pyVar47 + 0x10;
      } while (cVar41 == (code)0x30);
      lVar51 = 0;
      lVar28 = 0;
      while ((digi_table[(byte)cVar41] & 3) != 0) {
        lVar28 = lVar28 * 10 + (ulong)(byte)((char)cVar41 - 0x30);
        cVar41 = p_Var38[1];
        p_Var38 = p_Var38 + 1;
        pyVar47 = pyVar47 + 0x10;
        lVar51 = lVar51 + 1;
      }
      if (lVar51 < 0x13) {
        lVar51 = -lVar28;
        if (cVar33 != (code)0x2d) {
          lVar51 = lVar28;
        }
        p_Var53 = p_Var53 + lVar51;
        local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
        goto LAB_01b97aab;
      }
      if (cVar33 == (code)0x2d) {
        pyVar27[1].root = (yyjson_val *)0x14;
        pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)((ulong)(bVar42 == 0x2d) << 0x3f);
        local_4b0 = p_Var38;
        local_4a8 = pre;
        local_480 = val;
        local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
      }
      else if (cVar56 < '\0') {
        if (*pre != (u8 *)0x0) {
          **pre = '\0';
        }
        pyVar27[1].root = pyVar47;
        pyVar27[1].alc.malloc = (_func_void_ptr_void_ptr_size_t *)cur;
        *pre = (u8 *)p_Var38;
        local_4b0 = p_Var38;
        local_4a8 = pre;
        local_480 = val;
        local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
      }
      else {
        if ((flg & 0x10) == 0) {
          local_460 = "number is infinity when parsed as double";
          p_Var49 = (_func_void_ptr_void_ptr_size_t *)cur;
          local_4a8 = pre;
          local_480 = val;
          local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
          goto LAB_01b97ddb;
        }
        pyVar27[1].root = (yyjson_val *)0x14;
        pyVar27[1].alc.malloc =
             (_func_void_ptr_void_ptr_size_t *)
             (((ulong)(bVar42 != 0x2d) << 0x3f) + -0x10000000000000);
        local_4b0 = p_Var38;
        local_4a8 = pre;
        local_480 = val;
        local_468 = (_func_void_ptr_void_ptr_size_t *)cur;
      }
    }
LAB_01b977ae:
    pyVar25 = local_458;
    puVar24 = local_490;
    p_Var49 = local_4a0;
    if ((local_4b0 < local_4a0) && ((flg & 2) == 0)) {
      if ((flg & 8) == 0) {
        local_4b0 = local_4b0 + -1;
        do {
          pcVar1 = local_4b0 + 1;
          local_4b0 = local_4b0 + 1;
        } while ((char_table[(byte)*pcVar1] & 1) != 0);
      }
      else {
        local_4a8 = pre;
        local_480 = val;
        local_470 = pyVar27;
        bVar26 = skip_spaces_and_comments((u8 **)&local_4b0);
        p_Var54 = local_4b0;
        pyVar27 = local_470;
        pre = local_4a8;
        val = local_480;
        if ((!bVar26) && (*(ushort *)local_4b0 == 0x2a2f)) {
          bVar26 = is_truncated_end(puVar24,(u8 *)local_4b0,(u8 *)p_Var49,8,flg);
          if (bVar26) {
            p_Var54 = p_Var49;
          }
          pcVar35 = "unclosed multiline comment";
          if (bVar26) {
            pcVar35 = "unexpected end of data";
          }
          pyVar25->pos = (long)p_Var54 - (long)puVar24;
          pyVar25->code = (uint)!bVar26 * 3 + 5;
          pyVar25->msg = pcVar35;
          (*alc.free)(alc.ctx,local_470);
          goto LAB_01b97e36;
        }
      }
      p_Var54 = local_4b0;
      if (local_4b0 < p_Var49) {
        bVar26 = is_truncated_end(puVar24,(u8 *)local_4b0,(u8 *)p_Var49,4,flg);
        if (bVar26) {
          p_Var54 = p_Var49;
        }
        pcVar35 = "unexpected content after document";
        if (bVar26) {
          pcVar35 = "unexpected end of data";
        }
        local_458->pos = (long)p_Var54 - (long)puVar24;
        local_458->code = bVar26 + 4;
        local_458->msg = pcVar35;
        (*alc.free)(alc.ctx,pyVar27);
        goto LAB_01b97e36;
      }
    }
    if (((flg & 0xa0) != 0) && (*pre != (u8 *)0x0)) {
      **pre = '\0';
    }
    pyVar27->root = (yyjson_val *)val;
    (pyVar27->alc).malloc = alc.malloc;
    (pyVar27->alc).realloc = alc.realloc;
    (pyVar27->alc).free = alc.free;
    (pyVar27->alc).ctx = alc.ctx;
    pyVar27->dat_read = (long)local_4b0 - (long)puVar24;
    pyVar27->val_read = 1;
    puVar29 = (u8 *)0x0;
    if ((flg & 1) == 0) {
      puVar29 = puVar24;
    }
    pyVar27->str_pool = (char *)puVar29;
  }
  return pyVar27;
}

Assistant:

static_noinline yyjson_doc *read_root_single(u8 *hdr,
                                             u8 *cur,
                                             u8 *end,
                                             yyjson_alc alc,
                                             yyjson_read_flag flg,
                                             yyjson_read_err *err) {

#define return_err(_pos, _code, _msg) do { \
    if (is_truncated_end(hdr, _pos, end, YYJSON_READ_ERROR_##_code, flg)) { \
        err->pos = (usize)(end - hdr); \
        err->code = YYJSON_READ_ERROR_UNEXPECTED_END; \
        err->msg = "unexpected end of data"; \
    } else { \
        err->pos = (usize)(_pos - hdr); \
        err->code = YYJSON_READ_ERROR_##_code; \
        err->msg = _msg; \
    } \
    if (val_hdr) alc.free(alc.ctx, (void *)val_hdr); \
    return NULL; \
} while (false)

    usize hdr_len; /* value count used by doc */
    usize alc_num; /* value count capacity */
    yyjson_val *val_hdr; /* the head of allocated values */
    yyjson_val *val; /* current value */
    yyjson_doc *doc; /* the JSON document, equals to val_hdr */
    const char *msg; /* error message */

    bool raw; /* read number as raw */
    bool inv; /* allow invalid unicode */
    u8 *raw_end; /* raw end for null-terminator */
    u8 **pre; /* previous raw end pointer */

    hdr_len = sizeof(yyjson_doc) / sizeof(yyjson_val);
    hdr_len += (sizeof(yyjson_doc) % sizeof(yyjson_val)) > 0;
    alc_num = hdr_len + 1; /* single value */

    val_hdr = (yyjson_val *)alc.malloc(alc.ctx, alc_num * sizeof(yyjson_val));
    if (unlikely(!val_hdr)) goto fail_alloc;
    val = val_hdr + hdr_len;
    raw = has_read_flag(NUMBER_AS_RAW) || has_read_flag(BIGNUM_AS_RAW);
    inv = has_read_flag(ALLOW_INVALID_UNICODE) != 0;
    raw_end = NULL;
    pre = raw ? &raw_end : NULL;

    if (char_is_number(*cur)) {
        if (likely(read_number(&cur, pre, flg, val, &msg))) goto doc_end;
        goto fail_number;
    }
    if (*cur == '"') {
        if (likely(read_string(&cur, end, inv, val, &msg))) goto doc_end;
        goto fail_string;
    }
    if (*cur == 't') {
        if (likely(read_true(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'f') {
        if (likely(read_false(&cur, val))) goto doc_end;
        goto fail_literal;
    }
    if (*cur == 'n') {
        if (likely(read_null(&cur, val))) goto doc_end;
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (read_nan(false, &cur, pre, val)) goto doc_end;
        }
        goto fail_literal;
    }
    if (has_read_flag(ALLOW_INF_AND_NAN)) {
        if (read_inf_or_nan(false, &cur, pre, val)) goto doc_end;
    }
    goto fail_character;

doc_end:
    /* check invalid contents after json document */
    if (unlikely(cur < end) && !has_read_flag(STOP_WHEN_DONE)) {
        if (has_read_flag(ALLOW_COMMENTS)) {
            if (!skip_spaces_and_comments(&cur)) {
                if (byte_match_2(cur, "/*")) goto fail_comment;
            }
        } else {
            while (char_is_space(*cur)) cur++;
        }
        if (unlikely(cur < end)) goto fail_garbage;
    }

    if (pre && *pre) **pre = '\0';
    doc = (yyjson_doc *)val_hdr;
    doc->root = val_hdr + hdr_len;
    doc->alc = alc;
    doc->dat_read = (usize)(cur - hdr);
    doc->val_read = 1;
    doc->str_pool = has_read_flag(INSITU) ? NULL : (char *)hdr;
    return doc;

fail_string:
    return_err(cur, INVALID_STRING, msg);
fail_number:
    return_err(cur, INVALID_NUMBER, msg);
fail_alloc:
    return_err(cur, MEMORY_ALLOCATION, "memory allocation failed");
fail_literal:
    return_err(cur, LITERAL, "invalid literal");
fail_comment:
    return_err(cur, INVALID_COMMENT, "unclosed multiline comment");
fail_character:
    return_err(cur, UNEXPECTED_CHARACTER, "unexpected character");
fail_garbage:
    return_err(cur, UNEXPECTED_CONTENT, "unexpected content after document");

#undef return_err
}